

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

bool helics::helicsBoolValue(string_view val)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_37UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  value_type *res;
  bool local_1;
  
  pvVar1 = frozen::
           unordered_map<std::basic_string_view<char,std::char_traits<char>>,bool,37ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           ::find<std::basic_string_view<char,std::char_traits<char>>>(in_RSI,in_RDI);
  pvVar2 = frozen::
           unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_37UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_bool,_37UL,_frozen::elsa<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x3248d9);
  if (pvVar1 == pvVar2) {
    local_1 = true;
  }
  else {
    local_1 = (bool)(pvVar1->second & 1);
  }
  return local_1;
}

Assistant:

bool helicsBoolValue(std::string_view val)
{
    static constexpr const frozen::unordered_map<std::string_view, bool, 37> knownStrings{

        {"0", false},
        {"00", false},
        {std::string_view("\0", 1), false},
        {"0000", false},
        {std::string_view("\0\0\0\0\0\0\0\0", 8), false},
        {"1", true},
        {"false", false},
        {"true", true},
        {"on", true},
        {"off", false},
        {"ON", true},
        {"OFF", false},
        {"False", false},
        {"True", true},
        {"FALSE", false},
        {"TRUE", true},
        {"f", false},
        {"-", false},
        {"t", true},
        {"+", true},
        {"F", false},
        {"T", true},
        {"n", false},
        {"y", true},
        {"N", false},
        {"Y", true},
        {"no", false},
        {"yes", true},
        {"No", false},
        {"Yes", true},
        {"NO", false},
        {"YES", true},
        {"disable", false},
        {"enable", true},
        {"disabled", false},
        {"enabled", true},
        {"", false}};
    // all known false strings are captured in known strings so if it isn't in there it evaluates to
    // true
    const auto* res = knownStrings.find(val);
    if (res != knownStrings.end()) {
        return res->second;
    }
    return true;
}